

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

void __thiscall ThreadedReplayer::tear_down_threads(ThreadedReplayer *this)

{
  bool bVar1;
  reference this_00;
  thread *thread;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  lock_guard<std::mutex> lock;
  ThreadedReplayer *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&__range1,&this->pipeline_work_queue_mutex);
  this->shutting_down = true;
  std::condition_variable::notify_all();
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range1);
  __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin(&this->thread_pool);
  thread = (thread *)std::vector<std::thread,_std::allocator<std::thread>_>::end(&this->thread_pool)
  ;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                     *)&thread), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
              ::operator*(&__end1);
    bVar1 = std::thread::joinable(this_00);
    if (bVar1) {
      std::thread::join();
    }
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end1);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::clear(&this->thread_pool);
  return;
}

Assistant:

void tear_down_threads()
	{
		// Signal that it's time for threads to die.
		{
			lock_guard<mutex> lock(pipeline_work_queue_mutex);
			shutting_down = true;
			work_available_condition.notify_all();
		}

		for (auto &thread : thread_pool)
			if (thread.joinable())
				thread.join();
		thread_pool.clear();
	}